

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int multiquery(int sockfd,sockaddr_in *to,char **questions,size_t questions_size)

{
  int iVar1;
  ssize_t sVar2;
  ulong uVar3;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  char *dest;
  char buffer [520];
  char local_238 [4];
  ulong local_234;
  char local_22c [508];
  
  dest = local_22c;
  local_238[0] = '\0';
  local_238[1] = '\x02';
  local_238[2] = '\x01';
  local_238[3] = '\0';
  local_234 = (ulong)(ushort)((ushort)questions_size << 8 | (ushort)questions_size >> 8);
  if (questions_size != 0) {
    sVar4 = 0;
    do {
      iVar1 = str_to_label(dest,questions[sVar4],((int)local_238 - (int)dest) + 0x208);
      pcVar6 = dest + iVar1;
      dest = pcVar6 + 0x104;
      pcVar6[0] = '\0';
      pcVar6[1] = '\x01';
      pcVar6[2] = '\0';
      pcVar6[3] = '\x01';
      sVar4 = sVar4 + 1;
    } while (questions_size != sVar4);
  }
  uVar5 = (int)dest - (int)local_238;
  if (0 < (int)uVar5) {
    uVar3 = 0;
    do {
      printf("%d",(ulong)(uint)(int)local_238[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar3);
  }
  iVar1 = 0;
  sVar2 = sendto(sockfd,local_238,(long)(int)uVar5,0,(sockaddr *)to,0x10);
  if (sVar2 < 0) {
    puts("Failed");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int multiquery(int sockfd, struct sockaddr_in *to, char *questions[],
               size_t questions_size) {
  struct header_struct *header;
  struct question_struct *question;
  char *qname_pos, *question_pos;
  char buffer[MAX_DNS_SIZE];
  int i, qname_size = 0;
  int total_size = 0;

  header = (struct header_struct *)&buffer; //直接在buffer上写
  init_header(header);
  header->qdcount = htons(questions_size);

  qname_pos = buffer + DNS_HEADER_SIZE; //第一个question的位置
  for (i = 0; i < questions_size; i++) {
    qname_size = str_to_label(qname_pos, questions[i],
                              MAX_DNS_SIZE - (qname_pos - buffer));
    question_pos = qname_pos + qname_size;
    question = (struct question_struct *)question_pos;
    question->qclass = htons(1);
    question->qtype = htons(1);
    qname_pos += qname_size + QUERY_SIZE; //加上整个question的偏移量
  }
  total_size = qname_pos - buffer;
  for (int i = 0; i < total_size; i++) {
    printf("%d", buffer[i]);
  }
  if (sendto(sockfd, (char *)buffer, total_size, 0, (struct sockaddr *)to,
             sizeof(struct sockaddr_in)) < 0) {
    printf("Failed\n");
    return -1;
  }
  return 0;
}